

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeRow
          (SPxLPBase<double> *this,int n,LPRowBase<double> *newRow,bool scale)

{
  Item *pIVar1;
  int iVar2;
  int iVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  bool bVar6;
  undefined7 in_register_00000009;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  double val;
  int idx;
  int local_44;
  double local_40;
  undefined4 local_38;
  int local_34;
  
  local_38 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[(uint)n].idx;
    lVar7 = (long)(pIVar1->data).super_SVectorBase<double>.memused;
    if (0 < lVar7) {
      do {
        pIVar4 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
        iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                [(pIVar1->data).super_SVectorBase<double>.m_elem[lVar7 + -1].idx].idx;
        pNVar5 = pIVar4[iVar2].data.super_SVectorBase<double>.m_elem;
        if (pNVar5 != (Nonzero<double> *)0x0) {
          iVar3 = pIVar4[iVar2].data.super_SVectorBase<double>.memused;
          if (0 < (long)iVar3) {
            piVar9 = &pNVar5->idx;
            lVar11 = 0;
            do {
              if (*piVar9 == n) {
                uVar10 = iVar3 - 1;
                pIVar4[iVar2].data.super_SVectorBase<double>.memused = uVar10;
                if ((int)lVar11 < (int)uVar10) {
                  *piVar9 = pNVar5[uVar10].idx;
                  ((Nonzero<double> *)(piVar9 + -2))->val = pNVar5[uVar10].val;
                }
                break;
              }
              lVar11 = lVar11 + 1;
              piVar9 = piVar9 + 4;
            } while (iVar3 != lVar11);
          }
        }
        bVar6 = 1 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar6);
    }
    (pIVar1->data).super_SVectorBase<double>.memused = 0;
    local_40 = newRow->left;
    local_44 = n;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
              (this,(ulong)(uint)n,&local_40,(ulong)scale);
    local_40 = newRow->right;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
              (this,(ulong)(uint)n,&local_40,(ulong)scale);
    local_40 = newRow->object;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x3c])
              (this,(ulong)(uint)n,&local_40,(ulong)scale);
    lVar7 = (long)(newRow->vec).super_SVectorBase<double>.memused;
    if (0 < lVar7) {
      uVar8 = lVar7 + 1;
      lVar7 = lVar7 * 0x10 + -8;
      do {
        pNVar5 = (newRow->vec).super_SVectorBase<double>.m_elem;
        local_34 = *(int *)((long)&pNVar5->val + lVar7);
        local_40 = *(double *)((long)pNVar5 + lVar7 + -8);
        if ((char)local_38 != '\0') {
          local_40 = ldexp(local_40,(this->super_LPColSetBase<double>).scaleExp.data[local_34] +
                                    (this->super_LPRowSetBase<double>).scaleExp.data[local_44]);
        }
        SVSetBase<double>::add2
                  ((SVSetBase<double> *)this,
                   (SVectorBase<double> *)
                   ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[local_44].
                   idx),1,&local_34,&local_40);
        SVSetBase<double>::add2
                  (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
                   (SVectorBase<double> *)
                   ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_34].
                   idx),1,&local_44,&local_40);
        uVar8 = uVar8 - 1;
        lVar7 = lVar7 + -0x10;
      } while (1 < uVar8);
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }